

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int latin1ToUTF8(uchar *out,int *outlen,uchar *in,int *inlen,void *vctxt)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  
  iVar6 = (int)out;
  iVar5 = (int)in;
  iVar3 = -1;
  if ((((inlen != (int *)0x0) && (outlen != (int *)0x0)) && (out != (uchar *)0x0)) &&
     (in != (uchar *)0x0)) {
    pbVar4 = out + *outlen;
    pbVar7 = in + *inlen;
    do {
      if (pbVar7 <= in) {
        iVar3 = (int)out - iVar6;
        goto LAB_0012c729;
      }
      bVar1 = *in;
      if ((char)bVar1 < '\0') {
        if ((long)pbVar4 - (long)out < 2) goto LAB_0012c6f5;
        *out = bVar1 >> 6 | 0xc0;
        out[1] = bVar1 & 0xbf;
        out = out + 2;
LAB_0012c712:
        in = in + 1;
        bVar2 = true;
      }
      else {
        if (out < pbVar4) {
          *out = bVar1;
          out = out + 1;
          goto LAB_0012c712;
        }
LAB_0012c6f5:
        bVar2 = false;
      }
    } while (bVar2);
    iVar3 = -3;
LAB_0012c729:
    *outlen = (int)out - iVar6;
    *inlen = (int)in - iVar5;
  }
  return iVar3;
}

Assistant:

static int
latin1ToUTF8(unsigned char* out, int *outlen,
             const unsigned char* in, int *inlen,
             void *vctxt ATTRIBUTE_UNUSED) {
    unsigned char* outstart = out;
    const unsigned char* instart = in;
    unsigned char* outend;
    const unsigned char* inend;
    int ret = XML_ENC_ERR_SPACE;

    if ((out == NULL) || (in == NULL) || (outlen == NULL) || (inlen == NULL))
	return(XML_ENC_ERR_INTERNAL);

    outend = out + *outlen;
    inend = in + *inlen;

    while (in < inend) {
        unsigned c = *in;

	if (c < 0x80) {
            if (out >= outend)
                goto done;
            *out++ = c;
	} else {
            if (outend - out < 2)
                goto done;
	    *out++ = (c >> 6) | 0xC0;
            *out++ = (c & 0x3F) | 0x80;
        }

        in++;
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}